

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg.c
# Opt level: O2

char * xdg_get_path(char *xdg_env,char *default_path)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  passwd *ppVar3;
  char *__s;
  
  if (((xdg_env == (char *)0x0) || (default_path == (char *)0x0)) || (*default_path == '/')) {
    __assert_fail("xdg_env && default_path && default_path[0] != \'/\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/xdg/xdg.c",
                  0x35,"char *xdg_get_path(const char *, const char *)");
  }
  pcVar2 = getenv(xdg_env);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 == '/')) {
    pcVar2 = ccopy(pcVar2);
    pcVar2 = strip_slash(pcVar2);
    return pcVar2;
  }
  pcVar2 = getenv("HOME");
  if ((pcVar2 == (char *)0x0) || (*pcVar2 != '/')) {
    __uid = getuid();
    ppVar3 = getpwuid(__uid);
    if (ppVar3 == (passwd *)0x0) {
      return (char *)0x0;
    }
    pcVar2 = ppVar3->pw_dir;
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*pcVar2 != '/') {
      return (char *)0x0;
    }
  }
  pcVar2 = ccopy(pcVar2);
  if (pcVar2 != (char *)0x0) {
    iVar1 = snprintf((char *)0x0,0,"%s/%s",pcVar2,default_path);
    __s = (char *)calloc(1,(long)(iVar1 + 1));
    if (__s != (char *)0x0) {
      snprintf(__s,(long)(iVar1 + 1),"%s/%s",pcVar2,default_path);
      free(pcVar2);
      return __s;
    }
    free(pcVar2);
  }
  return (char *)0x0;
}

Assistant:

char*
xdg_get_path(const char *xdg_env, const char *default_path)
{
   assert(xdg_env && default_path && default_path[0] != '/');

   if (!xdg_env || !default_path || default_path[0] == '/')
      return NULL;

   const char *xdg_dir;
   if ((xdg_dir = getenv(xdg_env)) && xdg_dir[0] == '/')
      return strip_slash(ccopy(xdg_dir));

   char *home;
   if (!(home = get_home()))
      return NULL; /** fatal! */

   const size_t len = snprintf(NULL, 0, "%s/%s", home, default_path) + 1;

   char *path;
   if (!(path = calloc(1, len))) {
      free(home);
      return NULL; /** fatal! */
   }

   snprintf(path, len, "%s/%s", home, default_path);
   free(home);
   return path;
}